

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char (*value) [16])

{
  Message *in_RSI;
  AssertionResult *in_RDI;
  AssertionResult *unaff_retaddr;
  char (*val) [16];
  Message *in_stack_ffffffffffffffd0;
  char local_18 [8];
  AssertionResult *a_message;
  
  val = (char (*) [16])local_18;
  a_message = in_RDI;
  Message::Message(in_RSI);
  Message::operator<<(in_stack_ffffffffffffffd0,val);
  AppendMessage(unaff_retaddr,(Message *)a_message);
  Message::~Message((Message *)0x209b48);
  return in_RDI;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }